

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O2

bool __thiscall
KeyFileReader<NWN::ResRef16>::ReadEncapsulatedFile
          (KeyFileReader<NWN::ResRef16> *this,FileHandle File,size_t Offset,size_t BytesToRead,
          size_t *BytesRead,void *Buffer)

{
  pointer p_Var1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  p_Var1 = (this->m_KeyResDir).
           super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_KeyResDir).
                super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1;
  *BytesRead = 0;
  if ((p_Var1 != (pointer)0x0) && (uVar4 = File - 1, uVar4 < (ulong)(lVar3 / 0x28))) {
    iVar2 = (*((p_Var1[uVar4].BifFile)->super_IResourceAccessor<NWN::ResRef16>).
              _vptr_IResourceAccessor[1])
                      (p_Var1[uVar4].BifFile,(ulong)(p_Var1[uVar4].Res.ResID & 0xfffff),lVar3 % 0x28
                      );
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      iVar2 = (*((p_Var1[uVar4].BifFile)->super_IResourceAccessor<NWN::ResRef16>).
                _vptr_IResourceAccessor[3])
                        (p_Var1[uVar4].BifFile,lVar3,Offset,BytesToRead,BytesRead,Buffer);
      (*((p_Var1[uVar4].BifFile)->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[2]
      )(p_Var1[uVar4].BifFile,lVar3);
      return (bool)(char)iVar2;
    }
  }
  return false;
}

Assistant:

bool
KeyFileReader< ResRefT >::ReadEncapsulatedFile(
	 FileHandle File,
	 size_t Offset,
	 size_t BytesToRead,
	 size_t * BytesRead,
	 void * Buffer
	)
/*++

Routine Description:

	This routine logically reads an encapsulated sub-file within a BIF file
	that is attached to the KEY file.

	File reading is optimized for sequential scan.

Arguments:

	File - Supplies a file handle to the desired sub-file to read.

	Offset - Supplies the offset into the desired sub-file to read from.

	BytesToRead - Supplies the requested count of bytes to read.

	BytesRead - Receives the count of bytes transferred.

	Buffer - Supplies the address of a buffer to transfer raw encapsulated file
	         contents to.

Return Value:

	The routine returns a Boolean value indicating true on success, else false
	on failure.  An attempt to read from an invalid file handle, or an attempt
	to read beyond the end of file would be examples of failure conditions.

Environment:

	User mode.

--*/
{
	PCKEY_RESOURCE_DESCRIPTOR  ResKey;
	typename BifFileReaderT::FileHandle FileHandle;
	bool                       Status;

	//
	// First, locate the BIF file to read.
	//

	ResKey = LookupResourceKey( ((ResID) File) - 1 );

	*BytesRead = 0;

	if (ResKey == NULL)
		return false;

	//
	// Now delegate the read request to the specific BIF file that has been
	// chosen.
	//
	// N.B.  File open/close for BIF files is a no-op, so we avoid implementing
	//       an extra handle table indirection level here (as it would only
	//       slow things down).  The file open and close calls are essentially
	//       no-ops.
	//

	FileHandle = ResKey->BifFile->OpenFileByIndex(
		ResKey->Res.ResID & 0xFFFFF );

	if (FileHandle == INVALID_FILE)
		return false;

	Status = ResKey->BifFile->ReadEncapsulatedFile(
		FileHandle,
		Offset,
		BytesToRead,
		BytesRead,
		Buffer);

	ResKey->BifFile->CloseFile( FileHandle );
	FileHandle = INVALID_FILE;

	return Status;
}